

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_NodeAssignConst(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,int fConst1)

{
  Ivy_Obj_t *pIVar1;
  long lVar2;
  
  if ((*(uint *)&pObj->field_0x8 & 0xf) == 1) {
    pIVar1 = pObj->pFanout;
    for (lVar2 = 0; lVar2 < p->nSimWords; lVar2 = lVar2 + 1) {
      *(uint *)((long)&pIVar1->pFanout + lVar2 * 4) = -(uint)(fConst1 != 0);
    }
    return;
  }
  __assert_fail("Ivy_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x2c1,"void Ivy_NodeAssignConst(Ivy_FraigMan_t *, Ivy_Obj_t *, int)");
}

Assistant:

void Ivy_NodeAssignConst( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, int fConst1 )
{
    Ivy_FraigSim_t * pSims;
    int i;
    assert( Ivy_ObjIsPi(pObj) );
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        pSims->pData[i] = fConst1? ~(unsigned)0 : 0;
}